

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O1

void __thiscall Threadpool<Searchthread>::~Threadpool(Threadpool<Searchthread> *this)

{
  pointer ppSVar1;
  int in_ESI;
  
  if (((this->stop)._M_base._M_i & 1U) == 0) {
    exit(this,in_ESI);
  }
  std::condition_variable::~condition_variable(&this->cv_finished);
  std::condition_variable::~condition_variable(&this->cv_task);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque(&this->tasks)
  ;
  ppSVar1 = (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->workers).
                                  super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
    return;
  }
  return;
}

Assistant:

~Threadpool() { if (!stop) exit(); }